

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoozdedZomby.cpp
# Opt level: O3

void __thiscall BoozdedZomby::Zomby::~Zomby(Zomby *this)

{
  ~Zomby(this);
  operator_delete(this,0x98);
  return;
}

Assistant:

Zomby::~Zomby()
{
    _semaphore = false;

    if (_thread.joinable()) {
        _thread.detach();
    }

    if (_listener) {
        std::ostringstream buf;
        buf << typeid(*this).name() << "::" << __func__ << std::endl;
        _listener->processData(std::make_shared<Common::Listener::Data>(buf.str()));
    }
}